

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O3

TaskExecutionResult __thiscall
duckdb::HashAggregateDistinctFinalizeTask::AggregateDistinctGrouping
          (HashAggregateDistinctFinalizeTask *this,idx_t grouping_idx)

{
  _Atomic_word *p_Var1;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var2;
  HashAggregateGlobalSinkState *pHVar3;
  _Head_base<0UL,_duckdb::LocalSourceState_*,_false> _Var4;
  ClientContext *context;
  GroupingSet *pGVar5;
  undefined8 uVar6;
  SourceResultType SVar7;
  int iVar8;
  type pDVar9;
  const_reference pvVar10;
  reference this_00;
  type pDVar11;
  const_reference this_01;
  pointer pEVar12;
  BoundAggregateExpression *pBVar13;
  const_iterator cVar14;
  reference this_02;
  pointer pRVar15;
  type pLVar16;
  const_reference this_03;
  const_reference this_04;
  reference this_05;
  pointer this_06;
  reference this_07;
  type this_08;
  reference this_09;
  BoundReferenceExpression *pBVar17;
  reference pvVar18;
  reference pvVar19;
  type lstate_p;
  PhysicalHashAggregate *pPVar20;
  TaskExecutionResult TVar21;
  size_type __n;
  ulong uVar22;
  long lVar23;
  initializer_list<unsigned_long> __l;
  ExecutionContext execution_context;
  DataChunk group_chunk;
  OperatorSourceInput source_input;
  OperatorSinkInput sink_input;
  InterruptState interrupt_state;
  DataChunk output_chunk;
  DataChunk aggregate_input_chunk;
  ThreadContext thread_context;
  allocator_type local_2c9;
  idx_t *local_2c8;
  type local_2c0;
  unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> *local_2b8;
  const_reference local_2b0;
  unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
  *local_2a8;
  Event *local_2a0;
  type local_298;
  pointer local_290;
  pointer local_288;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_280;
  reference local_278;
  ExecutionContext local_270;
  weak_ptr<duckdb::Task,_true> local_258;
  RadixPartitionedHashTable local_248;
  long local_1e0;
  type local_1d8;
  size_type local_1d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1c8;
  OperatorSourceInput local_1b0;
  OperatorSinkInput local_198;
  InterruptState local_180;
  undefined1 local_158 [88];
  element_type *local_100;
  ThreadContext local_d8;
  
  pDVar9 = unique_ptr<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>,_true>
           ::operator*(&this->op->distinct_collection_info);
  pvVar10 = vector<duckdb::HashAggregateGroupingData,_true>::operator[]
                      (&this->op->groupings,grouping_idx);
  local_248.layout_ptr.internal.
  super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)grouping_idx;
  this_00 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::operator[]
                      (&this->gstate->grouping_states,grouping_idx);
  pDVar11 = unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
            ::operator*(&this_00->distinct_state);
  local_2b0 = pvVar10;
  local_2c0 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
              ::operator*(&pvVar10->distinct_data);
  local_248.layout_ptr.internal.
  super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pDVar9->aggregates;
  ThreadContext::ThreadContext(&local_d8,((this->super_ExecutorTask).executor)->context);
  local_270.pipeline.ptr = this->pipeline;
  local_270.client = ((this->super_ExecutorTask).executor)->context;
  local_270.thread = &local_d8;
  enable_shared_from_this<duckdb::Task>::shared_from_this
            ((enable_shared_from_this<duckdb::Task> *)&local_248);
  local_258.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_248.grouping_set;
  local_258.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_248.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_248.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_248.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start + 0xc) =
           *(_Atomic_word *)
            ((long)local_248.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                   .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + 0xc) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_248.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start + 0xc) =
           *(_Atomic_word *)
            ((long)local_248.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                   .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + 0xc) + 1;
    }
  }
  InterruptState::InterruptState(&local_180,&local_258);
  if (local_258.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_258.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar8 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar8 = (local_258.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_258.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar8 + -1;
    }
    if (iVar8 == 1) {
      (*(local_258.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_248.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_248.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  local_298 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
              ::operator*(&this_00->table_state);
  local_2b8 = &this->local_sink_state;
  if ((this->local_sink_state).
      super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
      super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
      .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl == (LocalSinkState *)0x0)
  {
    RadixPartitionedHashTable::GetLocalSinkState(&local_248,(ExecutionContext *)local_2b0);
    pGVar5 = local_248.grouping_set;
    local_248.grouping_set = (GroupingSet *)0x0;
    _Var2._M_head_impl =
         (local_2b8->
         super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
         .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl;
    (local_2b8->
    super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>.
    super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = (LocalSinkState *)pGVar5;
    if ((_Var2._M_head_impl != (LocalSinkState *)0x0) &&
       ((**(code **)((long)(_Var2._M_head_impl)->_vptr_LocalSinkState + 8))(),
       (LocalSinkState *)local_248.grouping_set != (LocalSinkState *)0x0)) {
      (*(*(_func_int ***)&(local_248.grouping_set)->_M_t)[1])();
    }
  }
  local_198.global_state = local_298;
  local_198.local_state =
       unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
       operator*(local_2b8);
  local_198.interrupt_state = &local_180;
  DataChunk::DataChunk((DataChunk *)&local_248);
  pPVar20 = this->op;
  if ((pPVar20->input_group_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pPVar20->input_group_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    DataChunk::Initialize
              ((DataChunk *)&local_248,((this->super_ExecutorTask).executor)->context,
               &pPVar20->input_group_types,0x800);
    pPVar20 = this->op;
  }
  local_288 = (pPVar20->grouped_aggregate_data).groups.
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_290 = (pPVar20->grouped_aggregate_data).groups.
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  DataChunk::DataChunk((DataChunk *)(local_158 + 0x40));
  pHVar3 = this->gstate;
  if ((pHVar3->payload_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pHVar3->payload_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    DataChunk::Initialize
              ((DataChunk *)(local_158 + 0x40),((this->super_ExecutorTask).executor)->context,
               &pHVar3->payload_types,0x800);
  }
  local_2a0 = shared_ptr<duckdb::Event,_true>::operator->(&(this->super_ExecutorTask).event);
  uVar22 = this->aggregation_idx;
  if (uVar22 < (ulong)((long)(this->op->grouped_aggregate_data).aggregates.
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->op->grouped_aggregate_data).aggregates.
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    local_1e0 = (long)local_290 - (long)local_288;
    lVar23 = local_1e0 >> 3;
    local_2c8 = &this->aggregation_idx;
    local_248.grouping_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&local_2c0->radix_tables;
    local_248.grouping_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&pDVar11->radix_states;
    local_2a8 = &this->radix_table_lstate;
    local_2a0 = (Event *)&local_2a0[1].total_tasks;
    local_248.grouping_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&pDVar11->distinct_output_chunks;
    do {
      this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                              *)local_248.layout_ptr.internal.
                                super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi,uVar22);
      pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_01);
      pBVar13 = BaseExpression::Cast<duckdb::BoundAggregateExpression>
                          (&pEVar12->super_BaseExpression);
      if (this->blocked == false) {
        this->payload_idx = this->next_payload_idx;
        this->next_payload_idx =
             ((long)(pBVar13->children).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pBVar13->children).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) + this->next_payload_idx;
      }
      local_158._0_8_ = *local_2c8;
      if (((local_2c0->radix_tables).
           super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (local_2c0->radix_tables).
           super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (cVar14 = ::std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(local_2c0->info->table_map)._M_h,(key_type *)local_158),
         cVar14.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
         _M_cur != (__node_type *)0x0)) {
        cVar14 = ::std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(local_2c0->info->table_map)._M_h,local_2c8);
        if (cVar14.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
            _M_cur == (__node_type *)0x0) {
          ::std::__throw_out_of_range("_Map_base::at");
        }
        local_278 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                                  *)local_248.grouping_values.
                                    super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 *(size_type *)
                                  ((long)cVar14.
                                         super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                         ._M_cur + 0x10));
        local_280 = cVar14.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                    _M_cur;
        this_02 = vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                                *)local_248.grouping_values.
                                  super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                  _M_impl.super__Vector_impl_data._M_finish,
                               *(size_type *)
                                ((long)cVar14.
                                       super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                       ._M_cur + 0x10));
        local_1d8 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                    ::operator*(this_02);
        if (this->blocked == false) {
          pRVar15 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                    ::operator->(local_278);
          RadixPartitionedHashTable::GetLocalSourceState
                    ((RadixPartitionedHashTable *)local_158,(ExecutionContext *)pRVar15);
          uVar6 = local_158._0_8_;
          local_158._0_8_ = (pointer)0x0;
          _Var4._M_head_impl =
               (local_2a8->
               super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
               .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl;
          (local_2a8->
          super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
          .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl =
               (LocalSourceState *)uVar6;
          if ((_Var4._M_head_impl != (LocalSourceState *)0x0) &&
             ((*(_Var4._M_head_impl)->_vptr_LocalSourceState[1])(),
             (pointer)local_158._0_8_ != (pointer)0x0)) {
            (*(*(_func_int ***)&((_Rep_type *)local_158._0_8_)->_M_impl)[1])();
          }
        }
        pLVar16 = unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
                  ::operator*(local_2a8);
        this_03 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>,_true>
                  ::operator[]((vector<duckdb::vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>,_true>
                                *)local_2a0,
                               (size_type)
                               local_248.layout_ptr.internal.
                               super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
        this_04 = vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
                  ::operator[](this_03,*local_2c8);
        local_1b0.global_state =
             unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
             ::operator*(this_04);
        local_1b0.interrupt_state = &local_180;
        local_1b0.local_state = pLVar16;
        DataChunk::DataChunk((DataChunk *)local_158);
        context = ((this->super_ExecutorTask).executor)->context;
        this_05 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                                *)local_248.grouping_values.
                                  super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                               *(size_type *)
                                ((long)&((local_280._M_cur)->
                                        super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                        ).
                                        super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                                        ._M_storage._M_storage + 8));
        this_06 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                  operator->(this_05);
        DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_1c8,this_06);
        DataChunk::Initialize
                  ((DataChunk *)local_158,context,(vector<duckdb::LogicalType,_true> *)&local_1c8,
                   0x800);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1c8);
        while( true ) {
          DataChunk::Reset((DataChunk *)local_158);
          DataChunk::Reset((DataChunk *)&local_248);
          DataChunk::Reset((DataChunk *)(local_158 + 0x40));
          pRVar15 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                    ::operator->(local_278);
          SVar7 = RadixPartitionedHashTable::GetData
                            (pRVar15,&local_270,(DataChunk *)local_158,local_1d8,&local_1b0);
          if (SVar7 == FINISHED) break;
          if (SVar7 == BLOCKED) {
            this->blocked = true;
            DataChunk::~DataChunk((DataChunk *)local_158);
            TVar21 = TASK_BLOCKED;
            goto LAB_014cd324;
          }
          this_07 = vector<duckdb::unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>,_true>
                    ::operator[](&local_2c0->grouped_aggregate_data,
                                 *(size_type *)
                                  ((long)&((local_280._M_cur)->
                                          super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                          ).
                                          super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                                          ._M_storage._M_storage + 8));
          this_08 = unique_ptr<duckdb::GroupedAggregateData,_std::default_delete<duckdb::GroupedAggregateData>,_true>
                    ::operator*(this_07);
          if (local_290 != local_288) {
            __n = 0;
            do {
              this_09 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        ::operator[](&this_08->groups,__n);
              pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator->(this_09);
              pBVar17 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                                  (&pEVar12->super_BaseExpression);
              pvVar18 = vector<duckdb::Vector,_true>::operator[]
                                  ((vector<duckdb::Vector,_true> *)&local_248,pBVar17->index);
              pvVar19 = vector<duckdb::Vector,_true>::operator[]
                                  ((vector<duckdb::Vector,_true> *)local_158,__n);
              Vector::Reference(pvVar18,pvVar19);
              __n = __n + 1;
            } while (lVar23 + (ulong)(lVar23 == 0) != __n);
          }
          local_248.null_groups.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_158._24_8_;
          if ((long)(this_08->groups).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this_08->groups).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != local_1e0) {
            uVar22 = 0;
            do {
              pvVar18 = vector<duckdb::Vector,_true>::operator[]
                                  ((vector<duckdb::Vector,_true> *)(local_158 + 0x40),
                                   this->payload_idx + uVar22);
              pvVar19 = vector<duckdb::Vector,_true>::operator[]
                                  ((vector<duckdb::Vector,_true> *)local_158,lVar23 + uVar22);
              Vector::Reference(pvVar18,pvVar19);
              uVar22 = uVar22 + 1;
            } while (uVar22 < (ulong)(((long)(this_08->groups).
                                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                             .
                                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this_08->groups).
                                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                             .
                                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) -
                                     lVar23));
          }
          local_100 = (element_type *)local_158._24_8_;
          local_1d0 = *local_2c8;
          __l._M_len = 1;
          __l._M_array = &local_1d0;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_1c8,__l,&local_2c9);
          RadixPartitionedHashTable::Sink
                    (&local_2b0->table_data,&local_270,(DataChunk *)&local_248,&local_198,
                     (DataChunk *)(local_158 + 0x40),(unsafe_vector<idx_t> *)&local_1c8);
          if (local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1c8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        this->blocked = false;
        DataChunk::~DataChunk((DataChunk *)local_158);
      }
      uVar22 = this->aggregation_idx + 1;
      this->aggregation_idx = uVar22;
    } while (uVar22 < (ulong)((long)(this->op->grouped_aggregate_data).aggregates.
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->op->grouped_aggregate_data).aggregates.
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  lstate_p = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
             operator*(local_2b8);
  RadixPartitionedHashTable::Combine(&local_2b0->table_data,&local_270,local_298,lstate_p);
  TVar21 = TASK_FINISHED;
LAB_014cd324:
  DataChunk::~DataChunk((DataChunk *)(local_158 + 0x40));
  DataChunk::~DataChunk((DataChunk *)&local_248);
  if (local_180.signal_state.internal.
      super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_180.signal_state.internal.
                 super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar8 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar8 = (local_180.signal_state.internal.
               super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_180.signal_state.internal.
       super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar8 + -1;
    }
    if (iVar8 == 1) {
      (*(local_180.signal_state.internal.
         super___weak_ptr<duckdb::InterruptDoneSignalState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if (local_180.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_180.current_task.internal.
                 super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_weak_count;
      iVar8 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar8 = (local_180.current_task.internal.
               super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_weak_count;
      (local_180.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = iVar8 + -1;
    }
    if (iVar8 == 1) {
      (*(local_180.current_task.internal.super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  ThreadContext::~ThreadContext(&local_d8);
  return TVar21;
}

Assistant:

TaskExecutionResult HashAggregateDistinctFinalizeTask::AggregateDistinctGrouping(const idx_t grouping_idx) {
	D_ASSERT(op.distinct_collection_info);
	auto &info = *op.distinct_collection_info;

	auto &grouping_data = op.groupings[grouping_idx];
	auto &grouping_state = gstate.grouping_states[grouping_idx];
	D_ASSERT(grouping_state.distinct_state);
	auto &distinct_state = *grouping_state.distinct_state;
	auto &distinct_data = *grouping_data.distinct_data;

	auto &aggregates = info.aggregates;

	// Thread-local contexts
	ThreadContext thread_context(executor.context);
	ExecutionContext execution_context(executor.context, thread_context, &pipeline);

	// Sink state to sink into global HTs
	InterruptState interrupt_state(shared_from_this());
	auto &global_sink_state = *grouping_state.table_state;
	if (!local_sink_state) {
		local_sink_state = grouping_data.table_data.GetLocalSinkState(execution_context);
	}
	OperatorSinkInput sink_input {global_sink_state, *local_sink_state, interrupt_state};

	// Create a chunk that mimics the 'input' chunk in Sink, for storing the group vectors
	DataChunk group_chunk;
	if (!op.input_group_types.empty()) {
		group_chunk.Initialize(executor.context, op.input_group_types);
	}

	const idx_t group_by_size = op.grouped_aggregate_data.groups.size();

	DataChunk aggregate_input_chunk;
	if (!gstate.payload_types.empty()) {
		aggregate_input_chunk.Initialize(executor.context, gstate.payload_types);
	}

	const auto &finalize_event = event->Cast<HashAggregateDistinctFinalizeEvent>();

	auto &agg_idx = aggregation_idx;
	for (; agg_idx < op.grouped_aggregate_data.aggregates.size(); agg_idx++) {
		auto &aggregate = aggregates[agg_idx]->Cast<BoundAggregateExpression>();

		if (!blocked) {
			// Forward the payload idx
			payload_idx = next_payload_idx;
			next_payload_idx = payload_idx + aggregate.children.size();
		}

		// If aggregate is not distinct, skip it
		if (!distinct_data.IsDistinct(agg_idx)) {
			continue;
		}

		D_ASSERT(distinct_data.info.table_map.count(agg_idx));
		const auto &table_idx = distinct_data.info.table_map.at(agg_idx);
		auto &radix_table = distinct_data.radix_tables[table_idx];

		auto &sink = *distinct_state.radix_states[table_idx];
		if (!blocked) {
			radix_table_lstate = radix_table->GetLocalSourceState(execution_context);
		}
		auto &local_source = *radix_table_lstate;
		OperatorSourceInput source_input {*finalize_event.global_source_states[grouping_idx][agg_idx], local_source,
		                                  interrupt_state};

		// Create a duplicate of the output_chunk, because of multi-threading we cant alter the original
		DataChunk output_chunk;
		output_chunk.Initialize(executor.context, distinct_state.distinct_output_chunks[table_idx]->GetTypes());

		// Fetch all the data from the aggregate ht, and Sink it into the main ht
		while (true) {
			output_chunk.Reset();
			group_chunk.Reset();
			aggregate_input_chunk.Reset();

			auto res = radix_table->GetData(execution_context, output_chunk, sink, source_input);
			if (res == SourceResultType::FINISHED) {
				D_ASSERT(output_chunk.size() == 0);
				break;
			} else if (res == SourceResultType::BLOCKED) {
				blocked = true;
				return TaskExecutionResult::TASK_BLOCKED;
			}

			auto &grouped_aggregate_data = *distinct_data.grouped_aggregate_data[table_idx];
			for (idx_t group_idx = 0; group_idx < group_by_size; group_idx++) {
				auto &group = grouped_aggregate_data.groups[group_idx];
				auto &bound_ref_expr = group->Cast<BoundReferenceExpression>();
				group_chunk.data[bound_ref_expr.index].Reference(output_chunk.data[group_idx]);
			}
			group_chunk.SetCardinality(output_chunk);

			for (idx_t child_idx = 0; child_idx < grouped_aggregate_data.groups.size() - group_by_size; child_idx++) {
				aggregate_input_chunk.data[payload_idx + child_idx].Reference(
				    output_chunk.data[group_by_size + child_idx]);
			}
			aggregate_input_chunk.SetCardinality(output_chunk);

			// Sink it into the main ht
			grouping_data.table_data.Sink(execution_context, group_chunk, sink_input, aggregate_input_chunk, {agg_idx});
		}
		blocked = false;
	}
	grouping_data.table_data.Combine(execution_context, global_sink_state, *local_sink_state);
	return TaskExecutionResult::TASK_FINISHED;
}